

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat2.c
# Opt level: O2

void mul_mat_gq_6(void *src0,void *src1,float *dst,int m,int n,int k)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((k & 0x1fU) != 0) {
    __assert_fail("k % 32 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                  ,0x931,"void mul_mat_gq_6(const void *, const void *, float *, int, int, int)");
  }
  iVar1 = 0;
  uVar2 = 0;
  if (0 < n) {
    uVar2 = (ulong)(uint)n;
  }
  if (m < 1) {
    m = 0;
  }
  for (; iVar1 != m; iVar1 = iVar1 + 1) {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      dst[uVar3] = 0.0;
    }
    dst = dst + n;
  }
  return;
}

Assistant:

void mul_mat_gq_6(
    const void * src0,
    const void * src1, // transposed
         float * dst,
    int m, int n, int k) {
    assert(k % 32 == 0);

    for (int ir0 = 0; ir0 < m; ir0++) {
        for (int ir1 = 0; ir1 < n; ir1++) {
            vec_dot_gq_6(k, dst + ir1, src0, src1);
            src1 = (const char *) src1 + quantize_6_row_size(k);
        }
        src0 = (const char *) src0 +   quantize_6_row_size(k);
        src1 = (const char *) src1 - n*quantize_6_row_size(k);

        dst = (float *) dst + n;
    }
}